

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marginalTrek++.cpp
# Opt level: O0

int IsoSpec::verify_atom_cnt(int atomCnt)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  int in_EDI;
  undefined3 in_stack_ffffffffffffffa8;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffffac;
  string local_28 [20];
  int in_stack_ffffffffffffffec;
  
  if (0x9ffffe < in_EDI) {
    uVar1 = CONCAT13(1,in_stack_ffffffffffffffa8);
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __cxa_allocate_exception(0x10);
    std::__cxx11::to_string(in_stack_ffffffffffffffec);
    std::operator+((char *)CONCAT44(in_stack_ffffffffffffffac,uVar1),__rhs);
    std::length_error::length_error((length_error *)__rhs,local_28);
    __cxa_throw(__rhs,&std::length_error::typeinfo,std::length_error::~length_error);
  }
  return in_EDI;
}

Assistant:

int verify_atom_cnt(int atomCnt)
{
    #if !ISOSPEC_BUILDING_OPENMS
    if(ISOSPEC_G_FACT_TABLE_SIZE-1 <= atomCnt)
        throw std::length_error("Subisotopologue too large, size limit (that is, the maximum number of atoms of a single element in a molecule) is: " + std::to_string(ISOSPEC_G_FACT_TABLE_SIZE-1));
    #endif
    return atomCnt;
}